

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O0

EC_T_BOOL PrintSlaveInfos(EC_T_DWORD dwInstanceID,CAtEmLogging *poLog)

{
  int iVar1;
  EC_T_CHAR *pEVar2;
  char *local_200;
  char *local_1f0;
  char *local_1e0;
  char *local_1d0;
  char *local_1c0;
  undefined1 local_184 [8];
  EC_T_CFG_SLAVE_INFO oCfgSlaveInfo;
  EC_T_BUS_SLAVE_INFO oBusSlaveInfo;
  EC_T_WORD wAutoIncAddress;
  EC_T_DWORD dwRes;
  CAtEmLogging *poLog_local;
  EC_T_DWORD dwInstanceID_local;
  
  oBusSlaveInfo.adwReserved[1]._2_2_ = 0;
  while ((oBusSlaveInfo.adwReserved[1]._2_2_ != 1 &&
         (iVar1 = emGetBusSlaveInfo(dwInstanceID,0,oBusSlaveInfo.adwReserved[1]._2_2_,
                                    oCfgSlaveInfo.adwReserved + 1), iVar1 == 0))) {
    CAtEmLogging::LogMsg
              (poLog,
               "******************************************************************************");
    CAtEmLogging::LogMsg(poLog,"Slave ID............: 0x%08X",(ulong)oCfgSlaveInfo.adwReserved[1]);
    CAtEmLogging::LogMsg
              (poLog,"Bus Index...........: %d",
               (ulong)(-(uint)oBusSlaveInfo.adwReserved[1]._2_2_ & 0xffff));
    CAtEmLogging::LogMsg
              (poLog,"Bus AutoInc Address.: 0x%04x",(ulong)oBusSlaveInfo.adwPortSlaveIds[2]._2_2_,
               (ulong)oBusSlaveInfo.adwPortSlaveIds[2]._2_2_);
    CAtEmLogging::LogMsg
              (poLog,"Bus Station Address.: 0x%04x (%4d)",(ulong)(ushort)oBusSlaveInfo._48_2_,
               (ulong)(ushort)oBusSlaveInfo._48_2_);
    CAtEmLogging::LogMsg
              (poLog,"Bus Alias Address...: 0x%04x (%4d)",(ulong)oBusSlaveInfo.wESCBuild,
               (ulong)oBusSlaveInfo.wESCBuild);
    pEVar2 = SlaveVendorText(oBusSlaveInfo.bDcSupport);
    CAtEmLogging::LogMsg
              (poLog,"Vendor ID...........: 0x%08X = %s",(ulong)(uint)oBusSlaveInfo.bDcSupport,
               pEVar2);
    pEVar2 = SlaveProdCodeText(oBusSlaveInfo.bDcSupport,oBusSlaveInfo.bDc64Support);
    CAtEmLogging::LogMsg
              (poLog,"Product Code........: 0x%08X = %s",(ulong)(uint)oBusSlaveInfo.bDc64Support,
               pEVar2);
    CAtEmLogging::LogMsg
              (poLog,"Revision............: 0x%08X   Serial Number: %d",
               (ulong)oBusSlaveInfo.dwVendorId,(ulong)oBusSlaveInfo.dwProductCode);
    pEVar2 = ESCTypeText((byte)oBusSlaveInfo.dwRevisionNumber);
    CAtEmLogging::LogMsg
              (poLog,"ESC Type............: %s (0x%x)  Revision: %d  Build: %d",pEVar2,
               (ulong)(byte)oBusSlaveInfo.dwRevisionNumber,
               (ulong)oBusSlaveInfo.dwRevisionNumber._1_1_,
               (ulong)oBusSlaveInfo.dwRevisionNumber._2_2_);
    if (((ushort)oBusSlaveInfo.adwPortSlaveIds[2] & 1) == 1) {
      local_1c0 = "yes";
    }
    else {
      local_1c0 = "no ";
    }
    CAtEmLogging::LogMsg
              (poLog,"Connection at Port A: %s (to 0x%08X)",local_1c0,
               (ulong)oCfgSlaveInfo.adwReserved[2]);
    if (((ushort)oBusSlaveInfo.adwPortSlaveIds[2] & 8) == 8) {
      local_1d0 = "yes";
    }
    else {
      local_1d0 = "no ";
    }
    CAtEmLogging::LogMsg
              (poLog,"Connection at Port D: %s (to 0x%08X)",local_1d0,
               (ulong)oBusSlaveInfo.adwPortSlaveIds[1]);
    if (((ushort)oBusSlaveInfo.adwPortSlaveIds[2] & 2) == 2) {
      local_1e0 = "yes";
    }
    else {
      local_1e0 = "no ";
    }
    CAtEmLogging::LogMsg
              (poLog,"Connection at Port B: %s (to 0x%08X)",local_1e0,(ulong)oBusSlaveInfo.dwSlaveId
              );
    if (((ushort)oBusSlaveInfo.adwPortSlaveIds[2] & 4) == 4) {
      local_1f0 = "yes";
    }
    else {
      local_1f0 = "no ";
    }
    CAtEmLogging::LogMsg
              (poLog,"Connection at Port C: %s (to 0x%08X)",local_1f0,
               (ulong)oBusSlaveInfo.adwPortSlaveIds[0]);
    if (oBusSlaveInfo._68_4_ == 0) {
      local_200 = "no ";
    }
    else {
      local_200 = "yes";
    }
    CAtEmLogging::LogMsg(poLog,"Line Crossed........: %s",local_200);
    iVar1 = emGetCfgSlaveInfo(dwInstanceID,1,oBusSlaveInfo._48_2_,local_184);
    if (iVar1 == 0) {
      CAtEmLogging::LogMsg
                (poLog,"Cfg Station Address.: 0x%04x (%4d)",
                 (ulong)(ushort)oCfgSlaveInfo.dwRevisionNumber,
                 (ulong)(ushort)oCfgSlaveInfo.dwRevisionNumber);
      if (oCfgSlaveInfo._112_4_ != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN    Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwSerialNumber >> 3),
                   (ulong)(oCfgSlaveInfo.dwSerialNumber & 7),(ulong)(uint)oCfgSlaveInfo._112_4_);
      }
      if (oCfgSlaveInfo.dwPdSizeIn != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT   Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsIn >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn & 7),
                   (ulong)oCfgSlaveInfo.dwPdSizeIn);
      }
      if (oCfgSlaveInfo.dwPdSizeOut != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN  2 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsOut >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut & 7),
                   (ulong)oCfgSlaveInfo.dwPdSizeOut);
      }
      if (oCfgSlaveInfo.dwPdSizeIn2 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT 2 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsIn2 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn2 & 7),
                   (ulong)oCfgSlaveInfo.dwPdSizeIn2);
      }
      if (oCfgSlaveInfo.dwPdSizeOut2 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN  3 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsOut2 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut2 & 7),
                   (ulong)oCfgSlaveInfo.dwPdSizeOut2);
      }
      if (oCfgSlaveInfo.dwPdSizeIn3 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT 3 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsIn3 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn3 & 7),
                   (ulong)oCfgSlaveInfo.dwPdSizeIn3);
      }
      if (oCfgSlaveInfo.dwPdSizeOut3 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN  4 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsOut3 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut3 & 7),
                   (ulong)oCfgSlaveInfo.dwPdSizeOut3);
      }
      if (oCfgSlaveInfo.dwPdSizeIn4 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT 4 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsIn4 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn4 & 7),
                   (ulong)oCfgSlaveInfo.dwPdSizeIn4);
      }
    }
    oBusSlaveInfo.adwReserved[1]._2_2_ = oBusSlaveInfo.adwReserved[1]._2_2_ - 1;
  }
  return 1;
}

Assistant:

EC_T_BOOL PrintSlaveInfos
    (EC_T_DWORD     dwInstanceID
    ,CAtEmLogging*  poLog)
{
EC_T_DWORD dwRes           = EC_E_ERROR;
EC_T_WORD  wAutoIncAddress = 0;

    /* get information about all bus slaves */
    for (wAutoIncAddress = 0; wAutoIncAddress != 1; wAutoIncAddress--)
    {
    EC_T_BUS_SLAVE_INFO oBusSlaveInfo;
    EC_T_CFG_SLAVE_INFO oCfgSlaveInfo;

        /* get bus slave information */
        dwRes = emGetBusSlaveInfo(dwInstanceID, EC_FALSE, wAutoIncAddress, &oBusSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            break;
        }
        LogMsg("******************************************************************************");
        LogMsg("Slave ID............: 0x%08X", oBusSlaveInfo.dwSlaveId);
        LogMsg("Bus Index...........: %d", (EC_T_WORD)(0-wAutoIncAddress));
        LogMsg("Bus AutoInc Address.: 0x%04x",       oBusSlaveInfo.wAutoIncAddress, oBusSlaveInfo.wAutoIncAddress);
        LogMsg("Bus Station Address.: 0x%04x (%4d)", oBusSlaveInfo.wStationAddress, oBusSlaveInfo.wStationAddress);
        LogMsg("Bus Alias Address...: 0x%04x (%4d)", oBusSlaveInfo.wAliasAddress,   oBusSlaveInfo.wAliasAddress);
        LogMsg("Vendor ID...........: 0x%08X = %s", oBusSlaveInfo.dwVendorId, SlaveVendorText((T_eEtherCAT_Vendor)oBusSlaveInfo.dwVendorId));
        LogMsg("Product Code........: 0x%08X = %s", oBusSlaveInfo.dwProductCode, SlaveProdCodeText((T_eEtherCAT_Vendor)oBusSlaveInfo.dwVendorId, (T_eEtherCAT_ProductCode)oBusSlaveInfo.dwProductCode));
        LogMsg("Revision............: 0x%08X   Serial Number: %d", oBusSlaveInfo.dwRevisionNumber, oBusSlaveInfo.dwSerialNumber);
        LogMsg("ESC Type............: %s (0x%x)  Revision: %d  Build: %d", ESCTypeText(oBusSlaveInfo.byESCType), oBusSlaveInfo.byESCType, oBusSlaveInfo.byESCRevision, oBusSlaveInfo.wESCBuild);
        LogMsg("Connection at Port A: %s (to 0x%08X)", ((1<<0)==(oBusSlaveInfo.wPortState & (1<<0)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[0]);
        LogMsg("Connection at Port D: %s (to 0x%08X)", ((1<<3)==(oBusSlaveInfo.wPortState & (1<<3)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[3]);
        LogMsg("Connection at Port B: %s (to 0x%08X)", ((1<<1)==(oBusSlaveInfo.wPortState & (1<<1)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[1]);
        LogMsg("Connection at Port C: %s (to 0x%08X)", ((1<<2)==(oBusSlaveInfo.wPortState & (1<<2)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[2]);
        LogMsg("Line Crossed........: %s", (oBusSlaveInfo.bLineCrossed)? "yes": "no ");

        /* get cfg slave information (matching bus slave) */
        dwRes = emGetCfgSlaveInfo(dwInstanceID, EC_TRUE, oBusSlaveInfo.wStationAddress, &oCfgSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            continue;
        }
        LogMsg("Cfg Station Address.: 0x%04x (%4d)", oCfgSlaveInfo.wStationAddress, oCfgSlaveInfo.wStationAddress);
        if (0 != oCfgSlaveInfo.dwPdSizeIn)
        {
            LogMsg("PD IN    Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn/8,  oCfgSlaveInfo.dwPdOffsIn%8,  oCfgSlaveInfo.dwPdSizeIn);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut)
        {
            LogMsg("PD OUT   Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut/8, oCfgSlaveInfo.dwPdOffsOut%8, oCfgSlaveInfo.dwPdSizeOut);
        }

        if (0 != oCfgSlaveInfo.dwPdSizeIn2)
        {
            LogMsg("PD IN  2 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn2/8,  oCfgSlaveInfo.dwPdOffsIn2%8,  oCfgSlaveInfo.dwPdSizeIn2);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut2)
        {
            LogMsg("PD OUT 2 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut2/8, oCfgSlaveInfo.dwPdOffsOut2%8, oCfgSlaveInfo.dwPdSizeOut2);
        }

        if (0 != oCfgSlaveInfo.dwPdSizeIn3)
        {
            LogMsg("PD IN  3 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn3/8,  oCfgSlaveInfo.dwPdOffsIn3%8,  oCfgSlaveInfo.dwPdSizeIn3);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut3)
        {
            LogMsg("PD OUT 3 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut3/8, oCfgSlaveInfo.dwPdOffsOut3%8, oCfgSlaveInfo.dwPdSizeOut3);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeIn4)
        {
            LogMsg("PD IN  4 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn4/8,  oCfgSlaveInfo.dwPdOffsIn4%8,  oCfgSlaveInfo.dwPdSizeIn4);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut4)
        {
            LogMsg("PD OUT 4 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut4/8, oCfgSlaveInfo.dwPdOffsOut4%8, oCfgSlaveInfo.dwPdSizeOut4);
        }
    }
    return EC_TRUE;
}